

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O1

void Of_ManComputeForward2(Of_Man_t *p)

{
  int *piVar1;
  int iVar2;
  undefined8 uVar3;
  void **ppvVar4;
  int *piVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  Gia_Man_t *pGVar9;
  uint uVar10;
  long lVar11;
  Of_Obj_t *pOVar12;
  uint *puVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  uint *pCut;
  uint *pCut_00;
  long lVar20;
  int local_48;
  
  pGVar9 = p->pGia;
  if (0 < pGVar9->nObjs) {
    lVar20 = 0;
    do {
      if (pGVar9->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      uVar3 = *(undefined8 *)(pGVar9->pObjs + lVar20);
      uVar10 = (uint)uVar3;
      if ((~uVar10 & 0x1fffffff) != 0 && -1 < (int)uVar10) {
        if ((((int)uVar10 < 0) || (uVar10 = uVar10 & 0x1fffffff, uVar10 == 0x1fffffff)) ||
           (uVar10 != ((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff))) {
          if ((p->vCutSets).nSize <= lVar20) {
LAB_00752106:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar10 = (p->vCutSets).pArray[lVar20];
          uVar15 = (int)uVar10 >> 0x10;
          if (((int)uVar15 < 0) || (iVar8 = (p->vPages).nSize, iVar8 <= (int)uVar15)) {
LAB_007520e7:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pOVar12 = p->pObjs;
          iVar2 = pOVar12[lVar20].Required;
          ppvVar4 = (p->vPages).pArray;
          puVar13 = (uint *)((ulong)((uVar10 & 0xffff) << 2) + (long)ppvVar4[uVar15]);
          if (pOVar12[lVar20].nRefs == 0) {
            local_48 = 0;
          }
          else {
            if (lVar20 == 0) {
              __assert_fail("iObj>0 && iObj<Gia_ManObjNum(p->pGia)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                            ,0x90,"int *Of_ObjCutBestP(Of_Man_t *, int)");
            }
            uVar10 = pOVar12[lVar20].iCutH >> 0x10;
            if (((int)uVar10 < 0) || (iVar8 <= (int)uVar10)) goto LAB_007520e7;
            local_48 = Of_CutDeref_rec(p,(int *)((ulong)((pOVar12[lVar20].iCutH & 0xffffU) << 2) +
                                                (long)ppvVar4[uVar10]));
          }
          if ((int)*puVar13 < 1) {
            pCut = (uint *)0x0;
          }
          else {
            pCut_00 = puVar13 + 1;
            iVar8 = 1000000000;
            pCut = (uint *)0x0;
            iVar18 = 0;
            do {
              uVar10 = 0;
              uVar15 = *pCut_00 & 0x1f;
              if (uVar15 != 0) {
                uVar14 = 0;
                uVar10 = 0;
                do {
                  uVar16 = pCut_00[uVar14 + 1];
                  if ((int)uVar16 < 0) {
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                                  ,0x12f,"int Abc_Lit2Var(int)");
                  }
                  if (uVar16 < 2) break;
                  uVar16 = p->pObjs[uVar16 >> 1].Delay1 + p->pPars->nDelayLut1;
                  if ((int)uVar10 <= (int)uVar16) {
                    uVar10 = uVar16;
                  }
                  uVar14 = uVar14 + 1;
                } while (uVar15 != uVar14);
              }
              pCut_00[(ulong)uVar15 + 1] = uVar10;
              if ((int)uVar10 <= iVar2) {
                if ((p->vCutRefs).nSize != 0) {
                  __assert_fail("Vec_IntSize(&p->vCutRefs) == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                                ,0x440,"int Of_CutAreaDerefed2(Of_Man_t *, int *)");
                }
                iVar7 = Of_CutRef2_rec(p,(int *)pCut_00);
                lVar11 = (long)(p->vCutRefs).nSize;
                if (0 < lVar11) {
                  piVar5 = (p->vCutRefs).pArray;
                  pOVar12 = p->pObjs;
                  lVar17 = 0;
                  do {
                    piVar1 = &pOVar12[piVar5[lVar17]].nRefs;
                    *piVar1 = *piVar1 + -1;
                    lVar17 = lVar17 + 1;
                  } while (lVar11 != lVar17);
                }
                (p->vCutRefs).nSize = 0;
                iVar19 = iVar8;
                if (iVar7 <= iVar8) {
                  iVar19 = iVar7;
                }
                bVar6 = iVar7 < iVar8;
                iVar8 = iVar19;
                if (bVar6) {
                  pCut = pCut_00;
                }
              }
              iVar18 = iVar18 + 1;
              pCut_00 = pCut_00 + (ulong)(*pCut_00 & 0x1f) + 4;
            } while (iVar18 < (int)*puVar13);
          }
          if (pCut == (uint *)0x0) {
            __assert_fail("pCutMin != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                          ,0x45c,"void Of_ManComputeForwardObj2(Of_Man_t *, int)");
          }
          if ((p->vCutSets).nSize <= lVar20) goto LAB_00752106;
          if (pCut < puVar13 || (long)pCut - (long)puVar13 == 0) {
            __assert_fail("pCut > pCutSet",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                          ,0x6c,"int Of_CutHandle(int *, int *)");
          }
          pOVar12 = p->pObjs;
          pOVar12[lVar20].iCutH =
               (int)((ulong)((long)pCut - (long)puVar13) >> 2) + (p->vCutSets).pArray[lVar20];
          if (pOVar12[lVar20].nRefs == 0) {
            iVar8 = 0;
          }
          else {
            iVar8 = Of_CutRef_rec(p,(int *)pCut);
          }
          if (local_48 < iVar8) {
            __assert_fail("AreaAft <= AreaBef",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                          ,0x460,"void Of_ManComputeForwardObj2(Of_Man_t *, int)");
          }
          uVar10 = pCut[(ulong)(*pCut & 0x1f) + 1];
          if (iVar2 < (int)uVar10) {
            __assert_fail("Delay <= Required",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                          ,0x462,"void Of_ManComputeForwardObj2(Of_Man_t *, int)");
          }
          pOVar12 = p->pObjs;
        }
        else {
          pOVar12 = p->pObjs;
          uVar10 = pOVar12[(int)((int)lVar20 - uVar10)].Delay1;
        }
        pOVar12[lVar20].Delay1 = uVar10;
      }
      lVar20 = lVar20 + 1;
      pGVar9 = p->pGia;
    } while (lVar20 < pGVar9->nObjs);
  }
  return;
}

Assistant:

void Of_ManComputeForward2( Of_Man_t * p )
{
    Gia_Obj_t * pObj; int i;
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
            Of_ObjSetDelay1( p, i, Of_ObjDelay1(p, Gia_ObjFaninId0(pObj, i)) );
        else
            Of_ManComputeForwardObj2( p, i );
}